

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h264d_vdpu34x.c
# Opt level: O0

MPP_RET vdpu34x_h264d_init(void *hal,MppHalCfg *cfg)

{
  long lVar1;
  uint uVar2;
  int iVar3;
  void *pvVar4;
  uint local_40;
  RK_U32 i;
  RK_U32 max_cnt;
  Vdpu34xH264dRegCtx *reg_ctx;
  H264dHalCtx_t *p_hal;
  MPP_RET ret;
  MppHalCfg *cfg_local;
  void *hal_local;
  
  if (hal == (void *)0x0) {
    if ((hal_h264d_debug & 4) != 0) {
      _mpp_log_l(4,"hal_h264d_vdpu34x","input empty(%d).\n",(char *)0x0,0x2c9);
    }
LAB_0022ee24:
    hal_local._4_4_ = MPP_OK;
  }
  else {
    pvVar4 = mpp_osal_calloc("vdpu34x_h264d_init",0x448);
    *(void **)((long)hal + 0x90) = pvVar4;
    if (pvVar4 == (void *)0x0) {
      p_hal._4_4_ = MPP_ERR_MALLOC;
      if ((hal_h264d_debug & 1) != 0) {
        _mpp_log_l(4,"hal_h264d_vdpu34x","malloc buffer error(%d).\n",(char *)0x0,0x2cb);
      }
      if (((hal_h264d_debug & 2) != 0) &&
         (_mpp_log_l(2,"hal_h264d_vdpu34x","Assertion %s failed at %s:%d\n",(char *)0x0,"0",
                     "vdpu34x_h264d_init",0x2cb), (mpp_debug & 0x10000000) != 0)) {
        abort();
      }
    }
    else {
      lVar1 = *(long *)((long)hal + 0x90);
      uVar2 = 1;
      if (*(int *)((long)hal + 0x98) != 0) {
        uVar2 = 3;
      }
      p_hal._4_4_ = mpp_buffer_get_with_tag
                              (*(MppBufferGroup *)((long)hal + 0x68),(MppBuffer *)(lVar1 + 0x310),
                               (ulong)(uVar2 * 0x6000 + 0x1000),"hal_h264d_vdpu34x",
                               "vdpu34x_h264d_init");
      if (MPP_NOK < p_hal._4_4_) {
        iVar3 = mpp_buffer_get_fd_with_caller(*(MppBuffer *)(lVar1 + 0x310),"vdpu34x_h264d_init");
        *(int *)(lVar1 + 0x318) = iVar3;
        pvVar4 = mpp_buffer_get_ptr_with_caller(*(MppBuffer *)(lVar1 + 0x310),"vdpu34x_h264d_init");
        *(void **)(lVar1 + 800) = pvVar4;
        *(undefined4 *)(lVar1 + 0x328) = 0;
        *(undefined4 *)(lVar1 + 0x32c) = 0x1000;
        for (local_40 = 0; local_40 < uVar2; local_40 = local_40 + 1) {
          pvVar4 = mpp_osal_calloc("vdpu34x_h264d_init",0x2a0);
          *(void **)(lVar1 + (ulong)local_40 * 0x10 + 0x360) = pvVar4;
          init_common_regs(*(Vdpu34xH264dRegSet **)(lVar1 + (ulong)local_40 * 0x10 + 0x360));
          *(uint *)(lVar1 + 0x330 + (ulong)local_40 * 4) = local_40 * 0x6000 + 0x1000;
          *(uint *)(lVar1 + 0x33c + (ulong)local_40 * 4) = local_40 * 0x6000 + 0x5000;
          *(uint *)(lVar1 + 0x348 + (ulong)local_40 * 4) = local_40 * 0x6000 + 0x6000;
        }
        if (*(int *)((long)hal + 0x98) == 0) {
          *(undefined8 *)(lVar1 + 0x440) = *(undefined8 *)(lVar1 + 0x360);
          *(undefined4 *)(lVar1 + 0x388) = *(undefined4 *)(lVar1 + 0x330);
          *(undefined4 *)(lVar1 + 0x38c) = *(undefined4 *)(lVar1 + 0x33c);
          *(undefined4 *)(lVar1 + 0x390) = *(undefined4 *)(lVar1 + 0x348);
        }
        memcpy((void *)(*(long *)(lVar1 + 800) + (ulong)*(uint *)(lVar1 + 0x328)),
               rkv_cabac_table_v34x,0xe80);
        mpp_slots_set_prop(*(MppBufSlots *)((long)hal + 0x50),SLOTS_HOR_ALIGN,rkv_hor_align);
        mpp_slots_set_prop(*(MppBufSlots *)((long)hal + 0x50),SLOTS_VER_ALIGN,rkv_ver_align);
        mpp_slots_set_prop(*(MppBufSlots *)((long)hal + 0x50),SLOTS_LEN_ALIGN,rkv_len_align);
        if (cfg->hal_fbc_adj_cfg != (SlotHalFbcAdjCfg *)0x0) {
          cfg->hal_fbc_adj_cfg->func = vdpu34x_afbc_align_calc;
          cfg->hal_fbc_adj_cfg->expand = 0x10;
        }
        goto LAB_0022ee24;
      }
      if ((hal_h264d_debug & 4) != 0) {
        _mpp_log_l(4,"hal_h264d_vdpu34x","Function error(%d).\n",(char *)0x0,0x2d2);
      }
    }
    vdpu34x_h264d_deinit(hal);
    hal_local._4_4_ = p_hal._4_4_;
  }
  return hal_local._4_4_;
}

Assistant:

MPP_RET vdpu34x_h264d_init(void *hal, MppHalCfg *cfg)
{
    MPP_RET ret = MPP_ERR_UNKNOW;
    H264dHalCtx_t *p_hal = (H264dHalCtx_t *)hal;

    INP_CHECK(ret, NULL == p_hal);

    MEM_CHECK(ret, p_hal->reg_ctx = mpp_calloc_size(void, sizeof(Vdpu34xH264dRegCtx)));
    Vdpu34xH264dRegCtx *reg_ctx = (Vdpu34xH264dRegCtx *)p_hal->reg_ctx;
    RK_U32 max_cnt = p_hal->fast_mode ? VDPU34X_FAST_REG_SET_CNT : 1;
    RK_U32 i = 0;

    //!< malloc buffers
    FUN_CHECK(ret = mpp_buffer_get(p_hal->buf_group, &reg_ctx->bufs,
                                   VDPU34X_INFO_BUFFER_SIZE(max_cnt)));
    reg_ctx->bufs_fd = mpp_buffer_get_fd(reg_ctx->bufs);
    reg_ctx->bufs_ptr = mpp_buffer_get_ptr(reg_ctx->bufs);
    reg_ctx->offset_cabac = VDPU34X_CABAC_TAB_OFFSET;
    reg_ctx->offset_errinfo = VDPU34X_ERROR_INFO_OFFSET;
    for (i = 0; i < max_cnt; i++) {
        reg_ctx->reg_buf[i].regs = mpp_calloc(Vdpu34xH264dRegSet, 1);
        init_common_regs(reg_ctx->reg_buf[i].regs);
        reg_ctx->offset_spspps[i] = VDPU34X_SPSPPS_OFFSET(i);
        reg_ctx->offset_rps[i] = VDPU34X_RPS_OFFSET(i);
        reg_ctx->offset_sclst[i] = VDPU34X_SCALING_LIST_OFFSET(i);
    }

    if (!p_hal->fast_mode) {
        reg_ctx->regs = reg_ctx->reg_buf[0].regs;
        reg_ctx->spspps_offset = reg_ctx->offset_spspps[0];
        reg_ctx->rps_offset = reg_ctx->offset_rps[0];
        reg_ctx->sclst_offset = reg_ctx->offset_sclst[0];
    }

    //!< copy cabac table bytes
    memcpy((char *)reg_ctx->bufs_ptr + reg_ctx->offset_cabac,
           (void *)rkv_cabac_table_v34x, sizeof(rkv_cabac_table_v34x));

    mpp_slots_set_prop(p_hal->frame_slots, SLOTS_HOR_ALIGN, rkv_hor_align);
    mpp_slots_set_prop(p_hal->frame_slots, SLOTS_VER_ALIGN, rkv_ver_align);
    mpp_slots_set_prop(p_hal->frame_slots, SLOTS_LEN_ALIGN, rkv_len_align);

    if (cfg->hal_fbc_adj_cfg) {
        cfg->hal_fbc_adj_cfg->func = vdpu34x_afbc_align_calc;
        cfg->hal_fbc_adj_cfg->expand = 16;
    }

__RETURN:
    return MPP_OK;
__FAILED:
    vdpu34x_h264d_deinit(hal);

    return ret;
}